

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  size_t __size;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  pointer pMVar5;
  void *pvVar6;
  void *pvVar7;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar8;
  bool bVar9;
  DetectionOutput *pDVar10;
  size_type sVar11;
  pointer pvVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  undefined1 auVar16 [8];
  pointer pfVar17;
  float *pfVar18;
  uint uVar19;
  long lVar20;
  BBoxRect *__args;
  long lVar21;
  size_type __new_size;
  uint uVar22;
  ulong uVar23;
  size_type sVar24;
  void *pvVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  undefined4 extraout_XMM0_Db;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_198;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  pointer local_168;
  int local_160;
  int local_15c;
  void *local_158;
  iterator iStack_150;
  int *local_148;
  DetectionOutput *local_140;
  vector<float,_std::allocator<float>_> local_138;
  ulong local_120;
  undefined8 local_118;
  ulong local_100;
  size_type local_f8;
  pointer local_f0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_e8;
  long local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pointer local_a8;
  float *pfStack_a0;
  long local_98;
  undefined4 local_90;
  Allocator *local_88;
  undefined8 local_80;
  uint local_78;
  undefined4 local_74;
  long local_70;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_68;
  Option *local_60;
  float *local_58;
  float *local_50;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_48;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_15c = this->num_class;
  if (local_15c == -0xe9) {
    uVar22 = pMVar5[2].h;
  }
  else {
    iVar13 = pMVar5[2].w;
    iVar14 = iVar13 + 3;
    if (-1 < iVar13) {
      iVar14 = iVar13;
    }
    uVar22 = iVar14 >> 2;
  }
  uVar23 = (ulong)uVar22;
  piVar15 = &this->num_class;
  if (local_15c == -0xe9) {
    piVar15 = &pMVar5[1].h;
  }
  local_f8 = (size_type)*piVar15;
  local_88 = opt->workspace_allocator;
  local_a8 = (pointer)0x0;
  pfStack_a0 = (float *)0x0;
  local_98 = 4;
  local_90 = 1;
  local_80 = 0x400000002;
  local_74 = 1;
  lVar21 = (long)(int)(uVar22 * 4);
  if (uVar22 == 0) {
    iVar13 = -100;
  }
  else {
    __size = lVar21 * 4 + 4;
    local_78 = uVar22;
    local_70 = lVar21;
    if (local_88 == (Allocator *)0x0) {
      local_178 = (undefined1  [8])0x0;
      iVar13 = posix_memalign((void **)local_178,0x10,__size);
      auVar16 = (undefined1  [8])(pointer)0x0;
      if (iVar13 == 0) {
        auVar16 = local_178;
      }
    }
    else {
      auVar16 = (undefined1  [8])(**(code **)(*(long *)local_88 + 0x10))(local_88,__size);
    }
    pfStack_a0 = &((pointer)auVar16)->xmin + lVar21;
    (&((pointer)auVar16)->xmin)[lVar21] = 1.4013e-45;
    pvVar6 = pMVar5[2].data;
    if (local_15c == -0xe9) {
      pvVar25 = (void *)0x0;
    }
    else {
      pvVar25 = (void *)((long)pMVar5[2].w * pMVar5[2].elemsize + (long)pvVar6);
    }
    local_140 = this;
    local_120 = uVar23;
    local_100 = uVar23;
    local_f0 = pMVar5;
    local_a8 = (pointer)auVar16;
    local_68 = top_blobs;
    local_60 = opt;
    local_58 = pfStack_a0;
    if (0 < (int)uVar22) {
      pvVar7 = pMVar5->data;
      local_50 = this->variances;
      lVar21 = 0;
      do {
        pfVar18 = (float *)(lVar21 + (long)pvVar25);
        if (pvVar25 == (void *)0x0) {
          pfVar18 = local_50;
        }
        uVar4 = *(undefined8 *)((long)pvVar7 + lVar21);
        local_b8 = CONCAT44((float)((ulong)uVar4 >> 0x20) *
                            (float)((ulong)*(undefined8 *)pfVar18 >> 0x20),
                            (float)uVar4 * (float)*(undefined8 *)pfVar18);
        uStack_b0 = 0;
        uVar4 = *(undefined8 *)((long)pvVar7 + lVar21 + 8);
        fVar28 = (float)((ulong)uVar4 >> 0x20) *
                 (float)((ulong)*(undefined8 *)(pfVar18 + 2) >> 0x20);
        local_c8 = CONCAT44(fVar28,(float)uVar4 * (float)*(undefined8 *)(pfVar18 + 2));
        uStack_c0 = 0;
        fVar28 = expf(fVar28);
        local_118 = CONCAT44(extraout_XMM0_Db,fVar28);
        fVar28 = expf((float)local_c8);
        pfVar18 = (float *)((long)pvVar6 + lVar21);
        fVar30 = pfVar18[2] - *pfVar18;
        fVar31 = pfVar18[3] - pfVar18[1];
        fVar27 = (*pfVar18 + pfVar18[2]) * 0.5 + fVar30 * (float)local_b8;
        fVar29 = (pfVar18[1] + pfVar18[3]) * 0.5 + fVar31 * local_b8._4_4_;
        fVar28 = fVar28 * fVar30 * 0.5;
        fVar30 = (float)local_118 * fVar31 * 0.5;
        pfVar18 = (float *)((long)&((pointer)auVar16)->xmin + lVar21);
        *pfVar18 = fVar27 - fVar28;
        pfVar18[1] = fVar29 - fVar30;
        pfVar18[2] = fVar27 + fVar28;
        pfVar18[3] = fVar29 + fVar30;
        lVar21 = lVar21 + 0x10;
      } while (uVar23 << 4 != lVar21);
    }
    __new_size = local_f8;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_48,local_f8);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_e8,__new_size);
    if ((int)__new_size < 2) {
      local_178 = (undefined1  [8])0x0;
      uStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
    }
    else {
      sVar24 = 1;
      if (local_15c == -0xe9) {
        __new_size = 1;
      }
      uVar23 = 1;
      if (local_15c == -0xe9) {
        uVar23 = local_120;
      }
      local_118 = uVar23 << 2;
      local_c8 = local_118;
      do {
        uVar23 = local_120;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_100) {
          uVar26 = 0;
          lVar21 = local_118;
          do {
            fVar28 = *(float *)((long)local_f0[1].data + lVar21);
            local_158 = (void *)CONCAT44(local_158._4_4_,fVar28);
            if (local_140->confidence_threshold <= fVar28 &&
                fVar28 != local_140->confidence_threshold) {
              lVar20 = (long)(int)uVar26 * (long)local_80._4_4_ * local_98;
              local_178._4_4_ = *(float *)((long)&local_a8->ymin + lVar20);
              local_178._0_4_ = *(float *)((long)&local_a8->xmin + lVar20);
              uStack_170 = (pointer)CONCAT44(*(float *)((long)&local_a8->ymax + lVar20),
                                             *(float *)((long)&local_a8->xmax + lVar20));
              local_168 = (pointer)CONCAT44(local_168._4_4_,(int)sVar24);
              if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                           (iterator)
                           local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)local_178);
              }
              else {
                *(int *)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar24;
                *(undefined1 (*) [8])
                 local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_178;
                *(pointer *)
                 ((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) = uStack_170;
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_138,
                           (iterator)
                           local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_158);
              }
              else {
                *local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_158._0_4_;
                local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar26 = uVar26 + 1;
            lVar21 = lVar21 + __new_size * 4;
          } while (uVar23 != uVar26);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,&local_138)
        ;
        pDVar10 = local_140;
        iVar13 = local_140->nms_top_k;
        iVar14 = (int)((ulong)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar13,iVar14 * -0x33333333) != iVar13 + iVar14 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,
                     (long)iVar13);
          std::vector<float,_std::allocator<float>_>::resize(&local_138,(long)pDVar10->nms_top_k);
        }
        local_158 = (void *)0x0;
        iStack_150._M_current = (int *)0x0;
        local_148 = (int *)0x0;
        local_b8 = CONCAT44(local_b8._4_4_,pDVar10->nms_threshold);
        uVar22 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) * -0x33333333;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_178,(long)(int)uVar22,
                   (allocator_type *)&local_160);
        if (0 < (int)uVar22) {
          pfVar17 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
          uVar23 = 0;
          do {
            ((float *)local_178)[uVar23] =
                 ((float)((ulong)*(undefined8 *)pfVar17 >> 0x20) -
                 (float)((ulong)*(undefined8 *)(pfVar17 + -2) >> 0x20)) *
                 ((float)*(undefined8 *)pfVar17 - (float)*(undefined8 *)(pfVar17 + -2));
            uVar23 = uVar23 + 1;
            pfVar17 = pfVar17 + 5;
          } while ((uVar22 & 0x7fffffff) != uVar23);
          local_160 = 0;
          do {
            uVar19 = (uint)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2);
            if ((int)uVar19 < 1) {
LAB_0014a147:
              if (iStack_150._M_current == local_148) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_158,iStack_150,&local_160);
              }
              else {
                *iStack_150._M_current = local_160;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
            }
            else {
              pfVar18 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)local_160 * 5;
              fVar28 = *pfVar18;
              bVar9 = true;
              uVar23 = 0;
              do {
                lVar21 = (long)*(int *)((long)local_158 + uVar23 * 4);
                fVar27 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar21 * 5 + 2];
                fVar29 = 0.0;
                if (fVar28 <= fVar27) {
                  pfVar1 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar21 * 5;
                  fVar30 = pfVar18[2];
                  fVar31 = *pfVar1;
                  if (fVar31 <= fVar30) {
                    fVar2 = pfVar18[1];
                    fVar32 = pfVar1[3];
                    if (fVar2 <= fVar32) {
                      fVar3 = pfVar18[3];
                      fVar33 = pfVar1[1];
                      if (fVar33 <= fVar3) {
                        if (fVar30 <= fVar27) {
                          fVar27 = fVar30;
                        }
                        if (fVar31 <= fVar28) {
                          fVar31 = fVar28;
                        }
                        if (fVar3 <= fVar32) {
                          fVar32 = fVar3;
                        }
                        if (fVar33 <= fVar2) {
                          fVar33 = fVar2;
                        }
                        fVar29 = (fVar32 - fVar33) * (fVar27 - fVar31);
                      }
                    }
                  }
                }
                if ((float)local_b8 <
                    fVar29 / ((((float *)local_178)[local_160] - fVar29) +
                             ((float *)local_178)[lVar21])) {
                  bVar9 = false;
                }
                uVar23 = uVar23 + 1;
              } while ((uVar19 & 0x7fffffff) != uVar23);
              if (bVar9) goto LAB_0014a147;
            }
            local_160 = local_160 + 1;
          } while (local_160 < (int)uVar22);
        }
        if (local_178 != (undefined1  [8])0x0) {
          operator_delete((void *)local_178,(long)local_168 - (long)local_178);
        }
        if (0 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2)) {
          lVar21 = 0;
          do {
            lVar20 = (long)*(int *)((long)local_158 + lVar21 * 4);
            __args = (BBoxRect *)
                     (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar20 * 5);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_48.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar24);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,__args);
            }
            else {
              (__position._M_current)->label = __args->label;
              fVar28 = __args->ymin;
              fVar27 = __args->xmax;
              fVar29 = __args->ymax;
              (__position._M_current)->xmin = __args->xmin;
              (__position._M_current)->ymin = fVar28;
              (__position._M_current)->xmax = fVar27;
              (__position._M_current)->ymax = fVar29;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_e8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar24);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20);
            }
            else {
              *__position_00._M_current =
                   local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2));
        }
        if (local_158 != (void *)0x0) {
          operator_delete(local_158,(long)local_148 - (long)local_158);
        }
        sVar11 = local_f8;
        if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar24 = sVar24 + 1;
        local_118 = local_118 + local_c8;
      } while (sVar24 != sVar11);
      local_178 = (undefined1  [8])0x0;
      uStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (1 < (int)sVar11) {
        lVar21 = 0;
        do {
          pvVar12 = local_e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)local_178,uStack_170,
                     *(undefined8 *)
                      ((long)&local_48.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar21),
                     *(undefined8 *)
                      ((long)&local_48.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar21));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_198,
                     local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)&pvVar12[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar21),
                     *(undefined8 *)
                      ((long)&pvVar12[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar21));
          lVar21 = lVar21 + 0x18;
        } while (sVar11 * 0x18 + -0x18 != lVar21);
      }
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,&local_198);
    pDVar10 = local_140;
    iVar13 = local_140->keep_top_k;
    iVar14 = (int)((ulong)((long)uStack_170 - (long)local_178) >> 2);
    uVar22 = iVar14 * -0x33333333;
    if (SBORROW4(iVar13,uVar22) != iVar13 + iVar14 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,(long)iVar13);
      std::vector<float,_std::allocator<float>_>::resize(&local_198,(long)pDVar10->keep_top_k);
      uVar22 = (int)((ulong)((long)uStack_170 - (long)local_178) >> 2) * -0x33333333;
    }
    iVar13 = 0;
    if (uVar22 != 0) {
      this_02 = (local_68->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar22,4,local_60->blob_allocator);
      iVar13 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar13 = 0, 0 < (int)uVar22)) {
        iVar14 = this_02->w;
        sVar8 = this_02->elemsize;
        pfVar18 = (float *)((long)this_02->data + 0x14);
        piVar15 = (int *)((long)local_178 + 0x10);
        iVar13 = 0;
        uVar23 = 0;
        do {
          fVar28 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          pfVar18[-5] = (float)*piVar15;
          pfVar18[-4] = fVar28;
          pfVar18[-3] = ((BBoxRect *)(piVar15 + -4))->xmin;
          pfVar18[-2] = (float)piVar15[-3];
          pfVar18[-1] = (float)piVar15[-2];
          *pfVar18 = (float)piVar15[-1];
          uVar23 = uVar23 + 1;
          pfVar18 = (float *)((long)pfVar18 + (long)iVar14 * sVar8);
          piVar15 = piVar15 + 5;
        } while (uVar22 != uVar23);
      }
    }
    if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178 != (undefined1  [8])0x0) {
      operator_delete((void *)local_178,(long)local_168 - (long)local_178);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_e8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_48);
    LOCK();
    *local_58 = (float)((int)*local_58 + -1);
    UNLOCK();
    if (*local_58 == 0.0) {
      if (local_88 == (Allocator *)0x0) {
        if (local_a8 != (pointer)0x0) {
          free(local_a8);
        }
      }
      else {
        (**(code **)(*(long *)local_88 + 0x18))();
      }
    }
  }
  return iVar13;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}